

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.c
# Opt level: O1

int thread_pool_worker(void *data)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  long *plVar4;
  undefined8 uVar5;
  undefined8 *puVar6;
  long lVar7;
  int iVar8;
  
  lVar3 = *data;
  plVar4 = *(long **)((long)data + 8);
  uVar5 = *(undefined8 *)((long)data + 0x10);
  plVar2 = plVar4 + 0x12;
  do {
    mtx_lock(plVar2);
    while (puVar6 = (undefined8 *)*plVar4, puVar6 == (undefined8 *)0x0) {
      if ((*(char *)(lVar3 + 0x10) != '\0') || (iVar8 = cnd_wait(plVar4 + 6,plVar2), iVar8 != 0)) {
        mtx_unlock(plVar2);
        return 0;
      }
    }
    lVar7 = puVar6[1];
    *plVar4 = lVar7;
    if (lVar7 == 0) {
      if ((undefined8 *)plVar4[1] != puVar6) {
        __assert_fail("queue->last_item == item",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/madmann91[P]rt/src/core/thread_pool.c"
                      ,0x4f,"int thread_pool_worker(void *)");
      }
      plVar4[1] = 0;
    }
    plVar4[5] = plVar4[5] + 1;
    mtx_unlock(plVar2);
    (*(code *)*puVar6)(puVar6,uVar5);
    mtx_lock(plVar2);
    puVar6[1] = plVar4[2];
    plVar4[2] = (long)puVar6;
    lVar7 = plVar4[3];
    plVar1 = plVar4 + 5;
    *plVar1 = *plVar1 + -1;
    plVar4[3] = lVar7 + 1U;
    if (((*plVar1 == 0) && (*plVar4 == 0)) || (plVar4[4] - 1U < lVar7 + 1U)) {
      cnd_signal(plVar4 + 0xc);
    }
    mtx_unlock(plVar2);
  } while( true );
}

Assistant:

static int thread_pool_worker(void* data) {
    struct thread_data* thread_data = data;
    struct work_queue* queue = thread_data->queue;
    struct thread_pool* thread_pool = thread_data->thread_pool;
    size_t thread_id = thread_data->thread_id;
    while (true) {
        mtx_lock(&queue->mutex);
        while (!queue->first_item) {
            if (thread_pool->should_stop || cnd_wait(&queue->avail_cond, &queue->mutex) != thrd_success)
                goto end;
        }
        struct work_item* item = queue->first_item;
        queue->first_item = item->next;
        if (!queue->first_item) {
            assert(queue->last_item == item);
            queue->last_item = NULL;
        }
        queue->worked_on++;
        mtx_unlock(&queue->mutex);

        item->work_fn(item, thread_id);

        mtx_lock(&queue->mutex);
        item->next = queue->done_items;
        queue->done_items = item;
        queue->worked_on--;
        queue->done_count++;
        if (!waiting_condition(queue))
            cnd_signal(&queue->done_cond);
        mtx_unlock(&queue->mutex);
    }
end:
    mtx_unlock(&queue->mutex);
    return 0;
}